

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYRef<short>,_ImPlot::TransformerLogLin>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYRef<short>,_ImPlot::TransformerLogLin>
               *this,GetterXsYs<short> *getter1,GetterXsYRef<short> *getter2,
              TransformerLogLin *transformer,ImU32 col)

{
  ImVec2 IVar1;
  short sVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  GetterXsYRef<short> *pGVar5;
  TransformerLogLin *pTVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  long lVar14;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar3 = getter1->Count;
  iVar13 = getter2->Count;
  if (iVar3 < getter2->Count) {
    iVar13 = iVar3;
  }
  this->Prims = iVar13 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar12 = GImPlot;
  (this->P12).y = 0.0;
  lVar14 = (long)((getter1->Offset % iVar3 + iVar3) % iVar3) * (long)getter1->Stride;
  sVar2 = *(short *)((long)getter1->Ys + lVar14);
  dVar9 = log10((double)(int)*(short *)((long)getter1->Xs + lVar14) /
                (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar12->CurrentPlot;
  dVar10 = (pIVar4->XAxis).Range.Min;
  iVar3 = transformer->YAxis;
  IVar1 = pIVar12->PixelRange[iVar3].Min;
  IVar7.y = (float)(pIVar12->My[iVar3] * ((double)(int)sVar2 - pIVar4->YAxis[iVar3].Range.Min) +
                   (double)IVar1.y);
  IVar7.x = (float)(pIVar12->Mx *
                    (((double)(float)(dVar9 / pIVar12->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar10) + dVar10) - dVar10) + (double)IVar1.x);
  this->P11 = IVar7;
  pIVar12 = GImPlot;
  pGVar5 = this->Getter2;
  pTVar6 = this->Transformer;
  iVar3 = pGVar5->Count;
  dVar9 = pGVar5->YRef;
  dVar10 = log10((double)(int)*(short *)((long)pGVar5->Xs +
                                        (long)((pGVar5->Offset % iVar3 + iVar3) % iVar3) *
                                        (long)pGVar5->Stride) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar12->CurrentPlot;
  dVar11 = (pIVar4->XAxis).Range.Min;
  iVar3 = pTVar6->YAxis;
  IVar1 = pIVar12->PixelRange[iVar3].Min;
  IVar8.y = (float)(pIVar12->My[iVar3] * (dVar9 - pIVar4->YAxis[iVar3].Range.Min) + (double)IVar1.y)
  ;
  IVar8.x = (float)(pIVar12->Mx *
                    (((double)(float)(dVar10 / pIVar12->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar11) + dVar11) - dVar11) + (double)IVar1.x);
  this->P12 = IVar8;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }